

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O2

VariableIndex __thiscall
cnn::ComputationGraph::add_lookup(ComputationGraph *this,LookupParameters *p,uint index)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  uint in_ECX;
  undefined4 in_register_00000014;
  _func_int **pp_Var4;
  Node *local_28;
  
  pp_Var4 = (_func_int **)CONCAT44(in_register_00000014,index);
  *(int *)&(this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start =
       (int)((ulong)(*(long *)(p->dim).d - (long)(p->super_ParametersBase)._vptr_ParametersBase) >>
            3);
  local_28 = (Node *)operator_new(0xa8);
  (local_28->dim).nd = 0;
  (local_28->dim).bd = 1;
  (local_28->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_28->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_28->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28->_vptr_Node = (_func_int **)&PTR__LookupNode_0035f6f0;
  pVVar1 = (pointer)pp_Var4[2];
  pVVar2 = (pointer)pp_Var4[3];
  pVVar3 = (pointer)pp_Var4[4];
  local_28[1]._vptr_Node = (_func_int **)pp_Var4[1];
  local_28[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = pVVar1;
  local_28[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = pVVar2;
  local_28[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pVVar3;
  local_28[1].dim.d[0] = *(uint *)(pp_Var4 + 5);
  local_28[1].dim.d[1] = in_ECX;
  *(uint **)(local_28[1].dim.d + 2) = local_28[1].dim.d + 1;
  *(undefined1 (*) [32])(local_28[1].dim.d + 4) = ZEXT832(0) << 0x20;
  local_28[2]._vptr_Node = pp_Var4;
  std::vector<cnn::Node*,std::allocator<cnn::Node*>>::emplace_back<cnn::Node*>
            ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)p,&local_28);
  std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::push_back
            ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)((p->dim).d + 4),
             (value_type *)this);
  set_dim_for_new_node((ComputationGraph *)p,(VariableIndex *)this);
  return (VariableIndex)(uint)this;
}

Assistant:

VariableIndex ComputationGraph::add_lookup(LookupParameters* p, unsigned index) {
  VariableIndex new_node_index(nodes.size());
  LookupNode* new_node = new LookupNode(p, index);
  nodes.push_back(new_node);
  parameter_nodes.push_back(new_node_index);
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}